

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O0

int sat_solver3_push(sat_solver3 *s,int p)

{
  int *piVar1;
  int iVar2;
  lit lVar3;
  lit *plVar4;
  int local_20;
  int fConfl;
  int h;
  int p_local;
  sat_solver3 *s_local;
  
  iVar2 = lit_var(p);
  if (s->size <= iVar2) {
    __assert_fail("lit_var(p) < s->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                  ,0x79d,"int sat_solver3_push(sat_solver3 *, int)");
  }
  veci_push(&s->trail_lim,s->qtail);
  s->root_level = s->root_level + 1;
  iVar2 = sat_solver3_enqueue(s,p,0);
  if (iVar2 == 0) {
    piVar1 = s->reasons;
    iVar2 = lit_var(p);
    local_20 = piVar1[iVar2];
    if (local_20 == 0) {
      veci_resize(&s->conf_final,0);
      lVar3 = lit_neg(p);
      veci_push(&s->conf_final,lVar3);
      iVar2 = lit_var(p);
      iVar2 = var_level(s,iVar2);
      if (0 < iVar2) {
        veci_push(&s->conf_final,p);
      }
    }
    else {
      iVar2 = clause_is_lit(local_20);
      if (iVar2 != 0) {
        lVar3 = lit_neg(p);
        plVar4 = clause_begin(s->binary);
        plVar4[1] = lVar3;
        lVar3 = clause_read_lit(local_20);
        plVar4 = clause_begin(s->binary);
        *plVar4 = lVar3;
        local_20 = s->hBinary;
      }
      sat_solver3_analyze_final(s,local_20,1);
      lVar3 = lit_neg(p);
      veci_push(&s->conf_final,lVar3);
    }
    s_local._4_4_ = 0;
  }
  else {
    iVar2 = sat_solver3_propagate(s);
    if (iVar2 == 0) {
      s_local._4_4_ = 1;
    }
    else {
      sat_solver3_analyze_final(s,iVar2,0);
      s_local._4_4_ = 0;
    }
  }
  return s_local._4_4_;
}

Assistant:

int sat_solver3_push(sat_solver3* s, int p)
{
    assert(lit_var(p) < s->size);
    veci_push(&s->trail_lim,s->qtail);
    s->root_level++;
    if (!sat_solver3_enqueue(s,p,0))
    {
        int h = s->reasons[lit_var(p)];
        if (h)
        {
            if (clause_is_lit(h))
            {
                (clause_begin(s->binary))[1] = lit_neg(p);
                (clause_begin(s->binary))[0] = clause_read_lit(h);
                h = s->hBinary;
            }
            sat_solver3_analyze_final(s, h, 1);
            veci_push(&s->conf_final, lit_neg(p));
        }
        else
        {
            veci_resize(&s->conf_final,0);
            veci_push(&s->conf_final, lit_neg(p));
            // the two lines below are a bug fix by Siert Wieringa 
            if (var_level(s, lit_var(p)) > 0)
                veci_push(&s->conf_final, p);
        }
        //sat_solver3_canceluntil(s, 0);
        return false; 
    }
    else
    {
        int fConfl = sat_solver3_propagate(s);
        if (fConfl){
            sat_solver3_analyze_final(s, fConfl, 0);
            //assert(s->conf_final.size > 0);
            //sat_solver3_canceluntil(s, 0);
            return false; }
    }
    return true;
}